

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void gc_finalize(lua_State *L)

{
  global_State *g;
  GCobj *pGVar1;
  GCobj *o;
  TValue *pTVar2;
  cTValue *mo;
  TValue tmp;
  cTValue local_20;
  
  g = (global_State *)(L->glref).ptr64;
  pGVar1 = (GCobj *)(g->gc).mmudata.gcptr64;
  o = *(GCobj **)pGVar1;
  if (o == pGVar1) {
    (g->gc).mmudata.gcptr64 = 0;
  }
  else {
    (pGVar1->gch).nextgc.gcptr64 = (o->gch).nextgc.gcptr64;
  }
  if ((o->gch).gct == '\n') {
    (o->gch).nextgc.gcptr64 = (g->gc).root.gcptr64;
    (g->gc).root.gcptr64 = (uint64_t)o;
    (o->gch).marked = (g->gc).currentwhite & 3 | (o->gch).marked & 0xe8;
    local_20.u64 = (ulong)o | 0xfffa800000000000;
    pTVar2 = lj_tab_set(L,*(GCtab **)((g->ctype_state).ptr64 + 0x20),&local_20);
    if (pTVar2->u64 != 0xffffffffffffffff) {
      (g->gc).nocdatafin = '\0';
      local_20.gcr.gcptr64 = (GCRef)*pTVar2;
      pTVar2->u64 = 0xffffffffffffffff;
      gc_call_finalizer(g,L,&local_20,o);
    }
  }
  else {
    (o->gch).nextgc.gcptr64 = *(uint64_t *)(g->mainthref).gcptr64;
    *(GCobj **)(g->mainthref).gcptr64 = o;
    (o->gch).marked = (g->gc).currentwhite & 3 | (o->gch).marked & 0xf8;
    pTVar2 = (o->th).base;
    if ((pTVar2 != (TValue *)0x0) && ((*(byte *)((long)pTVar2 + 10) & 4) == 0)) {
      mo = lj_meta_cache((GCtab *)&pTVar2->gcr,MM_gc,(GCstr *)g->gcroot[2].gcptr64);
      if (mo != (cTValue *)0x0) {
        gc_call_finalizer(g,L,mo,o);
        return;
      }
    }
  }
  return;
}

Assistant:

static void gc_finalize(lua_State *L)
{
  global_State *g = G(L);
  GCobj *o = gcnext(gcref(g->gc.mmudata));
  cTValue *mo;
  lj_assertG(tvref(g->jit_base) == NULL, "finalizer called on trace");
  /* Unchain from list of userdata to be finalized. */
  if (o == gcref(g->gc.mmudata))
    setgcrefnull(g->gc.mmudata);
  else
    setgcrefr(gcref(g->gc.mmudata)->gch.nextgc, o->gch.nextgc);
#if LJ_HASFFI
  if (o->gch.gct == ~LJ_TCDATA) {
    TValue tmp, *tv;
    /* Add cdata back to the GC list and make it white. */
    setgcrefr(o->gch.nextgc, g->gc.root);
    setgcref(g->gc.root, o);
    makewhite(g, o);
    o->gch.marked &= (uint8_t)~LJ_GC_CDATA_FIN;
    /* Resolve finalizer. */
    setcdataV(L, &tmp, gco2cd(o));
    tv = lj_tab_set(L, ctype_ctsG(g)->finalizer, &tmp);
    if (!tvisnil(tv)) {
      g->gc.nocdatafin = 0;
      copyTV(L, &tmp, tv);
      setnilV(tv);  /* Clear entry in finalizer table. */
      gc_call_finalizer(g, L, &tmp, o);
    }
    return;
  }
#endif
  /* Add userdata back to the main userdata list and make it white. */
  setgcrefr(o->gch.nextgc, mainthread(g)->nextgc);
  setgcref(mainthread(g)->nextgc, o);
  makewhite(g, o);
  /* Resolve the __gc metamethod. */
  mo = lj_meta_fastg(g, tabref(gco2ud(o)->metatable), MM_gc);
  if (mo)
    gc_call_finalizer(g, L, mo, o);
}